

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O0

bool __thiscall
CustomWidgetsInfo::extends
          (CustomWidgetsInfo *this,QString *classNameIn,QAnyStringView baseClassName)

{
  bool bVar1;
  DomCustomWidget *pDVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  DomCustomWidget *c;
  QString extends;
  QString className;
  DomCustomWidget *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar3;
  byte local_69;
  QString local_58;
  QString local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_RDI)
  ;
  bVar1 = ::operator==((QAnyStringView *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (QAnyStringView *)in_stack_ffffffffffffff58);
  if (bVar1) {
    local_69 = 1;
  }
  else {
    local_40[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_40[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_40[0].d.size = -0x5555555555555556;
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     (QString *)in_stack_ffffffffffffff58);
    while( true ) {
      pDVar2 = customWidget((CustomWidgetsInfo *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (QString *)in_stack_ffffffffffffff58);
      if (pDVar2 == (DomCustomWidget *)0x0) break;
      local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_58.d.size = -0x5555555555555556;
      DomCustomWidget::elementExtends(in_stack_ffffffffffffff58);
      bVar1 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           (QString *)in_stack_ffffffffffffff58);
      if (bVar1) {
        local_69 = 0;
        iVar3 = 1;
      }
      else {
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_RDI);
        bVar1 = ::operator==((QAnyStringView *)
                             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                             (QAnyStringView *)in_stack_ffffffffffffff58);
        if (bVar1) {
          local_69 = 1;
          iVar3 = 1;
        }
        else {
          QString::operator=(local_40,&local_58);
          iVar3 = 0;
        }
      }
      QString::~QString((QString *)0x16bce8);
      if (iVar3 != 0) goto LAB_0016bd04;
      in_stack_ffffffffffffff74 = 0;
    }
    local_69 = 0;
LAB_0016bd04:
    QString::~QString((QString *)0x16bd0e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_69 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CustomWidgetsInfo::extends(const QString &classNameIn, QAnyStringView baseClassName) const
{
    if (classNameIn == baseClassName)
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (extends == baseClassName)
            return true;
        className = extends;
    }
    return false;
}